

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O3

void Msat_SolverRemoveLearned(Msat_Solver_t *p)

{
  uint uVar1;
  int iVar2;
  Msat_Clause_t **ppMVar3;
  long lVar4;
  ulong uVar5;
  
  uVar1 = Msat_ClauseVecReadSize(p->vLearned);
  ppMVar3 = Msat_ClauseVecReadArray(p->vLearned);
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      iVar2 = Msat_ClauseIsLocked(p,ppMVar3[uVar5]);
      if (iVar2 != 0) {
        __assert_fail("!Msat_ClauseIsLocked( p, pLearned[i])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatSolverSearch.c"
                      ,0x17d,"void Msat_SolverRemoveLearned(Msat_Solver_t *)");
      }
      Msat_ClauseFree(p,ppMVar3[uVar5],1);
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  Msat_ClauseVecShrink(p->vLearned,0);
  iVar2 = Msat_ClauseVecReadSize(p->vClauses);
  p->nClauses = iVar2;
  iVar2 = p->nVarsAlloc;
  if (0 < (long)iVar2) {
    lVar4 = 0;
    do {
      p->pReasons[lVar4] = (Msat_Clause_t *)0x0;
      lVar4 = lVar4 + 1;
    } while (iVar2 != lVar4);
  }
  return;
}

Assistant:

void Msat_SolverRemoveLearned( Msat_Solver_t * p )
{
    Msat_Clause_t ** pLearned;
    int nLearned, i;

    // discard the learned clauses
    nLearned = Msat_ClauseVecReadSize( p->vLearned );
    pLearned = Msat_ClauseVecReadArray( p->vLearned );
    for ( i = 0; i < nLearned; i++ )
    {
        assert( !Msat_ClauseIsLocked( p, pLearned[i]) );
        
        Msat_ClauseFree( p, pLearned[i], 1 );
    }
    Msat_ClauseVecShrink( p->vLearned, 0 );
    p->nClauses = Msat_ClauseVecReadSize(p->vClauses);

    for ( i = 0; i < p->nVarsAlloc; i++ )
        p->pReasons[i] = NULL;
}